

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void ctemplate_htmlparser::Test_Htmlparser_Error::Run(void)

{
  int iVar1;
  char *pcVar2;
  allocator local_41;
  string local_40 [48];
  HtmlParser local_10;
  HtmlParser html;
  
  HtmlParser::HtmlParser(&local_10);
  pcVar2 = HtmlParser::GetErrorMessage(&local_10);
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","html.GetErrorMessage()","==","(const char *)__null")
    ;
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"<a href=\'http://www.google.com\' \'\'>\n",&local_41);
  iVar1 = HtmlParser::Parse(&local_10,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (iVar1 != 7) {
    fprintf(_stderr,"Check failed: %s %s %s\n",
            "html.Parse(\"<a href=\'http://www.google.com\' \'\'>\\n\")","==",
            "HtmlParser::STATE_ERROR");
    exit(1);
  }
  pcVar2 = HtmlParser::GetErrorMessage(&local_10);
  iVar1 = strcmp(pcVar2,"Unexpected character \'\\\'\' in state \'tag_space\'");
  if (iVar1 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(html.GetErrorMessage(), \"Unexpected character \'\\\\\'\' in state \'tag_space\'\") == 0"
           );
    exit(1);
  }
  HtmlParser::Reset(&local_10);
  pcVar2 = HtmlParser::GetErrorMessage(&local_10);
  if (pcVar2 != (char *)0x0) {
    fprintf(_stderr,"Check failed: %s %s %s\n","html.GetErrorMessage()","==","(const char *)__null")
    ;
    exit(1);
  }
  HtmlParser::~HtmlParser(&local_10);
  return;
}

Assistant:

TEST(Htmlparser, Error) {
  HtmlParser html;

  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
  EXPECT_EQ(html.Parse("<a href='http://www.google.com' ''>\n"),
            HtmlParser::STATE_ERROR);

  EXPECT_STREQ(html.GetErrorMessage(),
               "Unexpected character '\\'' in state 'tag_space'");
  html.Reset();
  EXPECT_EQ(html.GetErrorMessage(), (const char *)NULL);
}